

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1)

{
  size_t sVar1;
  pointer ppVVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  InstanceNameSyntax *pIVar10;
  long lVar11;
  
  pIVar10 = (InstanceNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceNameSyntax *)this->endPtr < pIVar10 + 1) {
    pIVar10 = (InstanceNameSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pIVar10 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar3 = args->info;
  (pIVar10->super_SyntaxNode).kind = InstanceName;
  (pIVar10->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pIVar10->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pIVar10->name).kind = TVar5;
  (pIVar10->name).field_0x2 = uVar6;
  (pIVar10->name).numFlags = (NumericTokenFlags)NVar7.raw;
  (pIVar10->name).rawLen = uVar8;
  (pIVar10->name).info = pIVar3;
  uVar9 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar9;
  (pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_1->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pIVar10->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pIVar10->dimensions).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar1 = (args_1->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pIVar10->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args_1->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
            _M_ptr;
  (pIVar10->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar1;
  (pIVar10->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005ae338;
  (pIVar10->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = &pIVar10->super_SyntaxNode;
  sVar1 = (pIVar10->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppVVar2 = (pIVar10->dimensions).
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar11 = 0;
    do {
      *(InstanceNameSyntax **)(*(long *)((long)ppVVar2 + lVar11) + 8) = pIVar10;
      lVar11 = lVar11 + 8;
    } while (sVar1 << 3 != lVar11);
  }
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }